

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

void immutable::rrb_details::ensure_internal_editable<int,false,6>
               (ref<immutable::rrb_details::internal_node<int,_false>_> *internal,guid_type guid)

{
  internal_node<int,_false> *piVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_20;
  guid_type local_14;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prStack_10;
  guid_type guid_local;
  ref<immutable::rrb_details::internal_node<int,_false>_> *internal_local;
  
  local_14 = guid;
  prStack_10 = internal;
  piVar1 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(internal);
  if (piVar1->guid != local_14) {
    piVar1 = transient_internal_node_clone<int,false,6>(prStack_10->ptr,local_14);
    ref<immutable::rrb_details::internal_node<int,_false>_>::ref(&local_20,piVar1);
    ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(prStack_10,&local_20);
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_20);
  }
  return;
}

Assistant:

inline void ensure_internal_editable(ref<internal_node<T, atomic_ref_counting>>& internal, guid_type guid)
      {
      if (internal->guid != guid)
        {
        internal = transient_internal_node_clone<T, atomic_ref_counting, N>(internal.ptr, guid);
        }
      }